

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImWchar codepoint_00;
  ImFont *pIVar1;
  bool bVar2;
  int iVar3;
  ImFontBuildSrcData *pIVar4;
  ImFontConfig *pIVar5;
  ImFont **ppIVar6;
  ImFontBuildDstData *pIVar7;
  stbrp_rect *psVar8;
  stbtt_packedchar *psVar9;
  int *piVar10;
  uchar *puVar11;
  ImWchar *pIVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  int local_440;
  int local_42c;
  int local_428;
  float local_408;
  ImWchar *local_388;
  int local_31c;
  float local_318;
  int src_i_7;
  float unused_y;
  float unused_x;
  stbtt_aligned_quad q;
  stbtt_packedchar *pc;
  int codepoint_1;
  int glyph_i_3;
  float font_off_y;
  float font_off_x;
  float descent;
  float ascent;
  int unscaled_line_gap;
  int unscaled_descent;
  int unscaled_ascent;
  float font_scale;
  ImFont *dst_font;
  ImFontConfig *cfg_3;
  ImFontBuildSrcData *src_tmp_6;
  int src_i_6;
  int glyph_i_2;
  stbrp_rect *r;
  uchar multiply_table [256];
  ImFontBuildSrcData *src_tmp_5;
  ImFontConfig *cfg_2;
  int src_i_5;
  int local_17c;
  ImFontBuildSrcData *pIStack_178;
  int glyph_i_1;
  ImFontBuildSrcData *src_tmp_4;
  undefined1 auStack_168 [4];
  int src_i_4;
  stbtt_pack_context spc;
  int TEX_HEIGHT_MAX;
  int surface_sqrt;
  int glyph_index_in_font;
  int y1;
  int x1;
  int y0;
  int x0;
  int glyph_i;
  int padding;
  float scale;
  ImFontConfig *cfg_1;
  ImFontBuildSrcData *src_tmp_3;
  int src_i_3;
  int buf_packedchars_out_n;
  int buf_rects_out_n;
  int total_surface;
  ImVector<stbtt_packedchar> buf_packedchars;
  ImVector<stbrp_rect> buf_rects;
  int dst_i;
  ImFontBuildSrcData *src_tmp_2;
  int src_i_2;
  uint codepoint;
  ImWchar *src_range_1;
  ImFontBuildDstData *dst_tmp_1;
  ImFontBuildSrcData *src_tmp_1;
  int src_i_1;
  int total_glyphs_count;
  ImWchar *src_range;
  ImFontBuildDstData *dst_tmp;
  int font_offset;
  int output_i;
  ImFontConfig *cfg;
  ImFontBuildSrcData *src_tmp;
  int src_i;
  undefined1 local_48 [8];
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  ImVec2 local_20;
  ImFontAtlas *local_18;
  ImFontAtlas *atlas_local;
  
  local_18 = atlas;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                  ,0x918,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  local_18->TexID = (ImTextureID)0x0;
  local_18->TexHeight = 0;
  local_18->TexWidth = 0;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  local_18->TexUvScale = local_20;
  ImVec2::ImVec2((ImVec2 *)&src_tmp_array.Data,0.0,0.0);
  local_18->TexUvWhitePixel = (ImVec2)src_tmp_array.Data;
  ImFontAtlas::ClearTexData(local_18);
  ImVector<ImFontBuildSrcData>::ImVector((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data);
  ImVector<ImFontBuildDstData>::ImVector((ImVector<ImFontBuildDstData> *)local_48);
  ImVector<ImFontBuildSrcData>::resize
            ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(local_18->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize
            ((ImVector<ImFontBuildDstData> *)local_48,(local_18->Fonts).Size);
  iVar3 = ImVector<ImFontBuildSrcData>::size_in_bytes
                    ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data);
  memset((void *)src_tmp_array._0_8_,0,(long)iVar3);
  iVar3 = ImVector<ImFontBuildDstData>::size_in_bytes((ImVector<ImFontBuildDstData> *)local_48);
  memset((void *)dst_tmp_array._0_8_,0,(long)iVar3);
  src_tmp._0_4_ = 0;
  do {
    if ((local_18->ConfigData).Size <= (int)src_tmp) {
      src_tmp_1._4_4_ = 0;
      for (src_tmp_1._0_4_ = 0; (int)src_tmp_1 < (int)dst_tmp_array.Data;
          src_tmp_1._0_4_ = (int)src_tmp_1 + 1) {
        pIVar4 = ImVector<ImFontBuildSrcData>::operator[]
                           ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(int)src_tmp_1);
        pIVar7 = ImVector<ImFontBuildDstData>::operator[]
                           ((ImVector<ImFontBuildDstData> *)local_48,pIVar4->DstIndex);
        ImBitVector::Create(&pIVar4->GlyphsSet,pIVar4->GlyphsHighest + 1);
        bVar13 = ImVector<unsigned_int>::empty(&(pIVar7->GlyphsSet).Storage);
        if (bVar13) {
          ImBitVector::Create(&pIVar7->GlyphsSet,pIVar7->GlyphsHighest + 1);
        }
        _src_i_2 = pIVar4->SrcRanges;
        while( true ) {
          bVar13 = false;
          if (*_src_i_2 != 0) {
            bVar13 = _src_i_2[1] != 0;
          }
          if (!bVar13) break;
          for (src_tmp_2._4_4_ = *_src_i_2; src_tmp_2._4_4_ <= _src_i_2[1];
              src_tmp_2._4_4_ = src_tmp_2._4_4_ + 1) {
            bVar13 = ImBitVector::TestBit(&pIVar7->GlyphsSet,src_tmp_2._4_4_);
            if ((!bVar13) &&
               (iVar3 = stbtt_FindGlyphIndex(&pIVar4->FontInfo,src_tmp_2._4_4_), iVar3 != 0)) {
              pIVar4->GlyphsCount = pIVar4->GlyphsCount + 1;
              pIVar7->GlyphsCount = pIVar7->GlyphsCount + 1;
              ImBitVector::SetBit(&pIVar4->GlyphsSet,src_tmp_2._4_4_);
              ImBitVector::SetBit(&pIVar7->GlyphsSet,src_tmp_2._4_4_);
              src_tmp_1._4_4_ = src_tmp_1._4_4_ + 1;
            }
          }
          _src_i_2 = _src_i_2 + 2;
        }
      }
      for (src_tmp_2._0_4_ = 0; (int)src_tmp_2 < (int)dst_tmp_array.Data;
          src_tmp_2._0_4_ = (int)src_tmp_2 + 1) {
        pIVar4 = ImVector<ImFontBuildSrcData>::operator[]
                           ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(int)src_tmp_2);
        ImVector<int>::reserve(&pIVar4->GlyphsList,pIVar4->GlyphsCount);
        UnpackBitVectorToFlatIndexList(&pIVar4->GlyphsSet,&pIVar4->GlyphsList);
        ImBitVector::Clear(&pIVar4->GlyphsSet);
        if ((pIVar4->GlyphsList).Size != pIVar4->GlyphsCount) {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                        ,0x96d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
      }
      for (buf_rects.Data._4_4_ = 0; buf_rects.Data._4_4_ < (int)local_48._0_4_;
          buf_rects.Data._4_4_ = buf_rects.Data._4_4_ + 1) {
        pIVar7 = ImVector<ImFontBuildDstData>::operator[]
                           ((ImVector<ImFontBuildDstData> *)local_48,buf_rects.Data._4_4_);
        ImBitVector::Clear(&pIVar7->GlyphsSet);
      }
      ImVector<ImFontBuildDstData>::clear((ImVector<ImFontBuildDstData> *)local_48);
      ImVector<stbrp_rect>::ImVector((ImVector<stbrp_rect> *)&buf_packedchars.Data);
      ImVector<stbtt_packedchar>::ImVector((ImVector<stbtt_packedchar> *)&buf_rects_out_n);
      ImVector<stbrp_rect>::resize((ImVector<stbrp_rect> *)&buf_packedchars.Data,src_tmp_1._4_4_);
      ImVector<stbtt_packedchar>::resize
                ((ImVector<stbtt_packedchar> *)&buf_rects_out_n,src_tmp_1._4_4_);
      iVar3 = ImVector<stbrp_rect>::size_in_bytes((ImVector<stbrp_rect> *)&buf_packedchars.Data);
      memset((void *)buf_rects._0_8_,0,(long)iVar3);
      iVar3 = ImVector<stbtt_packedchar>::size_in_bytes
                        ((ImVector<stbtt_packedchar> *)&buf_rects_out_n);
      memset((void *)buf_packedchars._0_8_,0,(long)iVar3);
      buf_packedchars_out_n = 0;
      src_i_3 = 0;
      src_tmp_3._4_4_ = 0;
      for (src_tmp_3._0_4_ = 0; (int)src_tmp_3 < (int)dst_tmp_array.Data;
          src_tmp_3._0_4_ = (int)src_tmp_3 + 1) {
        cfg_1 = (ImFontConfig *)
                ImVector<ImFontBuildSrcData>::operator[]
                          ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(int)src_tmp_3);
        if (((ImFontBuildSrcData *)cfg_1)->GlyphsCount != 0) {
          psVar8 = ImVector<stbrp_rect>::operator[]
                             ((ImVector<stbrp_rect> *)&buf_packedchars.Data,src_i_3);
          *(stbrp_rect **)&cfg_1[1].GlyphMinAdvanceX = psVar8;
          psVar9 = ImVector<stbtt_packedchar>::operator[]
                             ((ImVector<stbtt_packedchar> *)&buf_rects_out_n,src_tmp_3._4_4_);
          *(stbtt_packedchar **)&cfg_1[1].MergeMode = psVar9;
          src_i_3 = src_i_3 + *(int *)(cfg_1[1].Name + 8);
          src_tmp_3._4_4_ = src_tmp_3._4_4_ + *(int *)(cfg_1[1].Name + 8);
          _padding = ImVector<ImFontConfig>::operator[](&local_18->ConfigData,(int)src_tmp_3);
          cfg_1[1].OversampleH = (int)_padding->SizePixels;
          cfg_1[1].OversampleV = 0;
          *(ImFont **)&cfg_1[1].PixelSnapH = cfg_1[1].DstFont;
          cfg_1[1].GlyphExtraSpacing.y = *(float *)(cfg_1[1].Name + 0x20);
          *(undefined8 *)&cfg_1[1].GlyphOffset.y = *(undefined8 *)&cfg_1[1].MergeMode;
          *(char *)&cfg_1[1].GlyphRanges = (char)_padding->OversampleH;
          *(char *)((long)&cfg_1[1].GlyphRanges + 1) = (char)_padding->OversampleV;
          if (_padding->SizePixels <= 0.0) {
            local_408 = stbtt_ScaleForMappingEmToPixels
                                  ((stbtt_fontinfo *)cfg_1,-_padding->SizePixels);
          }
          else {
            local_408 = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)cfg_1,_padding->SizePixels);
          }
          glyph_i = (int)local_408;
          x0 = local_18->TexGlyphPadding;
          for (y0 = 0; pIVar5 = cfg_1, y0 < *(int *)(cfg_1[1].Name + 0x20); y0 = y0 + 1) {
            piVar10 = ImVector<int>::operator[]((ImVector<int> *)(cfg_1[1].Name + 0x20),y0);
            iVar3 = stbtt_FindGlyphIndex((stbtt_fontinfo *)pIVar5,*piVar10);
            if (iVar3 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                            ,0x99c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      ((stbtt_fontinfo *)cfg_1,iVar3,(float)glyph_i * (float)_padding->OversampleH,
                       (float)glyph_i * (float)_padding->OversampleV,0.0,0.0,&x1,&y1,
                       &glyph_index_in_font,&surface_sqrt);
            *(short *)(*(long *)&cfg_1[1].GlyphMinAdvanceX + (long)y0 * 0x10 + 4) =
                 ((short)glyph_index_in_font - (short)x1) + (short)x0 + (short)_padding->OversampleH
                 + -1;
            *(short *)(*(long *)&cfg_1[1].GlyphMinAdvanceX + (long)y0 * 0x10 + 6) =
                 ((short)surface_sqrt - (short)y1) + (short)x0 + (short)_padding->OversampleV + -1;
            buf_packedchars_out_n =
                 (uint)*(ushort *)(*(long *)&cfg_1[1].GlyphMinAdvanceX + (long)y0 * 0x10 + 4) *
                 (uint)*(ushort *)(*(long *)&cfg_1[1].GlyphMinAdvanceX + (long)y0 * 0x10 + 6) +
                 buf_packedchars_out_n;
          }
        }
      }
      fVar14 = sqrtf((float)buf_packedchars_out_n);
      spc.nodes._4_4_ = (int)fVar14 + 1;
      local_18->TexHeight = 0;
      if (local_18->TexDesiredWidth < 1) {
        if ((float)spc.nodes._4_4_ < 2867.2) {
          if ((float)spc.nodes._4_4_ < 1433.6) {
            local_42c = 0x200;
            if (716.8 <= (float)spc.nodes._4_4_) {
              local_42c = 0x400;
            }
          }
          else {
            local_42c = 0x800;
          }
          local_428 = local_42c;
        }
        else {
          local_428 = 0x1000;
        }
        local_18->TexWidth = local_428;
      }
      else {
        local_18->TexWidth = local_18->TexDesiredWidth;
      }
      spc.nodes._0_4_ = 0x8000;
      _auStack_168 = ZEXT812(0);
      register0x0000120c = 0;
      spc._8_16_ = _auStack_168;
      spc._24_16_ = _auStack_168;
      spc._40_16_ = _auStack_168;
      stbtt_PackBegin((stbtt_pack_context *)auStack_168,(uchar *)0x0,local_18->TexWidth,0x8000,0,
                      local_18->TexGlyphPadding,(void *)0x0);
      ImFontAtlasBuildPackCustomRects(local_18,spc.user_allocator_context);
      for (src_tmp_4._4_4_ = 0; src_tmp_4._4_4_ < (int)dst_tmp_array.Data;
          src_tmp_4._4_4_ = src_tmp_4._4_4_ + 1) {
        pIStack_178 = ImVector<ImFontBuildSrcData>::operator[]
                                ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,src_tmp_4._4_4_
                                );
        if (pIStack_178->GlyphsCount != 0) {
          stbrp_pack_rects((stbrp_context *)spc.user_allocator_context,pIStack_178->Rects,
                           pIStack_178->GlyphsCount);
          for (local_17c = 0; local_17c < pIStack_178->GlyphsCount; local_17c = local_17c + 1) {
            if (pIStack_178->Rects[local_17c].was_packed != 0) {
              iVar3 = ImMax<int>(local_18->TexHeight,
                                 (uint)pIStack_178->Rects[local_17c].y +
                                 (uint)pIStack_178->Rects[local_17c].h);
              local_18->TexHeight = iVar3;
            }
          }
        }
      }
      if ((local_18->Flags & 1U) == 0) {
        local_440 = ImUpperPowerOfTwo(local_18->TexHeight);
      }
      else {
        local_440 = local_18->TexHeight + 1;
      }
      local_18->TexHeight = local_440;
      ImVec2::ImVec2((ImVec2 *)((long)&cfg_2 + 4),1.0 / (float)local_18->TexWidth,
                     1.0 / (float)local_18->TexHeight);
      local_18->TexUvScale = stack0xfffffffffffffe7c;
      puVar11 = (uchar *)ImGui::MemAlloc((long)(local_18->TexWidth * local_18->TexHeight));
      local_18->TexPixelsAlpha8 = puVar11;
      memset(local_18->TexPixelsAlpha8,0,(long)(local_18->TexWidth * local_18->TexHeight));
      spc._40_8_ = local_18->TexPixelsAlpha8;
      spc.pack_info._4_4_ = local_18->TexHeight;
      for (cfg_2._0_4_ = 0; (int)cfg_2 < (int)dst_tmp_array.Data; cfg_2._0_4_ = (int)cfg_2 + 1) {
        pIVar5 = ImVector<ImFontConfig>::operator[](&local_18->ConfigData,(int)cfg_2);
        multiply_table._248_8_ =
             ImVector<ImFontBuildSrcData>::operator[]
                       ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(int)cfg_2);
        if (((ImFontBuildSrcData *)multiply_table._248_8_)->GlyphsCount != 0) {
          stbtt_PackFontRangesRenderIntoRects
                    ((stbtt_pack_context *)auStack_168,(stbtt_fontinfo *)multiply_table._248_8_,
                     &((ImFontBuildSrcData *)multiply_table._248_8_)->PackRange,1,
                     ((ImFontBuildSrcData *)multiply_table._248_8_)->Rects);
          if ((pIVar5->RasterizerMultiply != 1.0) || (NAN(pIVar5->RasterizerMultiply))) {
            ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&r,pIVar5->RasterizerMultiply);
            _src_i_6 = *(long *)(multiply_table._248_8_ + 200);
            for (src_tmp_6._4_4_ = 0; src_tmp_6._4_4_ < *(int *)(multiply_table._248_8_ + 0xe8);
                src_tmp_6._4_4_ = src_tmp_6._4_4_ + 1) {
              if (*(int *)(_src_i_6 + 0xc) != 0) {
                ImFontAtlasBuildMultiplyRectAlpha8
                          ((uchar *)&r,local_18->TexPixelsAlpha8,(uint)*(ushort *)(_src_i_6 + 8),
                           (uint)*(ushort *)(_src_i_6 + 10),(uint)*(ushort *)(_src_i_6 + 4),
                           (uint)*(ushort *)(_src_i_6 + 6),local_18->TexWidth);
              }
              _src_i_6 = _src_i_6 + 0x10;
            }
          }
          *(undefined8 *)(multiply_table._248_8_ + 200) = 0;
        }
      }
      stbtt_PackEnd((stbtt_pack_context *)auStack_168);
      ImVector<stbrp_rect>::clear((ImVector<stbrp_rect> *)&buf_packedchars.Data);
      for (src_tmp_6._0_4_ = 0; (int)src_tmp_6 < (int)dst_tmp_array.Data;
          src_tmp_6._0_4_ = (int)src_tmp_6 + 1) {
        cfg_3 = (ImFontConfig *)
                ImVector<ImFontBuildSrcData>::operator[]
                          ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(int)src_tmp_6);
        if (((ImFontBuildSrcData *)cfg_3)->GlyphsCount != 0) {
          dst_font = (ImFont *)
                     ImVector<ImFontConfig>::operator[](&local_18->ConfigData,(int)src_tmp_6);
          _unscaled_ascent = *(ImFont **)(dst_font->Used4kPagesMap + 0x10);
          unscaled_descent =
               (int)stbtt_ScaleForPixelHeight((stbtt_fontinfo *)cfg_3,dst_font->FontSize);
          stbtt_GetFontVMetrics
                    ((stbtt_fontinfo *)cfg_3,&unscaled_line_gap,(int *)&ascent,(int *)&descent);
          fVar14 = (float)unscaled_line_gap;
          fVar14 = ImFloor(fVar14 * (float)unscaled_descent +
                           (float)(int)(((0.0 < fVar14) - 1) + (uint)(0.0 < fVar14)));
          fVar15 = (float)(int)ascent;
          fVar15 = ImFloor(fVar15 * (float)unscaled_descent +
                           (float)(int)(((0.0 < fVar15) - 1) + (uint)(0.0 < fVar15)));
          ImFontAtlasBuildSetupFont
                    (local_18,_unscaled_ascent,(ImFontConfig *)dst_font,fVar14,fVar15);
          fVar14 = (float)(dst_font->Glyphs).Capacity;
          fVar15 = *(float *)&(dst_font->Glyphs).Data + (float)(int)(_unscaled_ascent->Ascent + 0.5)
          ;
          for (pc._4_4_ = 0; pc._4_4_ < *(int *)(cfg_3[1].Name + 8); pc._4_4_ = pc._4_4_ + 1) {
            pIVar12 = (ImWchar *)
                      ImVector<int>::operator[]((ImVector<int> *)(cfg_3[1].Name + 0x20),pc._4_4_);
            codepoint_00 = *pIVar12;
            q._24_8_ = *(long *)&cfg_3[1].MergeMode + (long)pc._4_4_ * 0x1c;
            src_i_7 = 0;
            local_318 = 0.0;
            stbtt_GetPackedQuad(*(stbtt_packedchar **)&cfg_3[1].MergeMode,local_18->TexWidth,
                                local_18->TexHeight,pc._4_4_,(float *)&src_i_7,&local_318,
                                (stbtt_aligned_quad *)&unused_y,0);
            ImFont::AddGlyph(_unscaled_ascent,(ImFontConfig *)dst_font,codepoint_00,
                             unused_y + fVar14,unused_x + fVar15,q.s0 + fVar14,q.t0 + fVar15,q.x0,
                             q.y0,q.x1,q.y1,*(float *)(q._24_8_ + 0x10));
          }
        }
      }
      for (local_31c = 0; local_31c < (int)dst_tmp_array.Data; local_31c = local_31c + 1) {
        pIVar4 = ImVector<ImFontBuildSrcData>::operator[]
                           ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,local_31c);
        ImFontBuildSrcData::~ImFontBuildSrcData(pIVar4);
      }
      ImFontAtlasBuildFinish(local_18);
      atlas_local._7_1_ = 1;
      ImVector<stbtt_packedchar>::~ImVector((ImVector<stbtt_packedchar> *)&buf_rects_out_n);
      ImVector<stbrp_rect>::~ImVector((ImVector<stbrp_rect> *)&buf_packedchars.Data);
LAB_003331a5:
      ImVector<ImFontBuildDstData>::~ImVector((ImVector<ImFontBuildDstData> *)local_48);
      ImVector<ImFontBuildSrcData>::~ImVector((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data);
      return (bool)(atlas_local._7_1_ & 1);
    }
    pIVar4 = ImVector<ImFontBuildSrcData>::operator[]
                       ((ImVector<ImFontBuildSrcData> *)&dst_tmp_array.Data,(int)src_tmp);
    pIVar5 = ImVector<ImFontConfig>::operator[](&local_18->ConfigData,(int)src_tmp);
    bVar13 = false;
    if (pIVar5->DstFont != (ImFont *)0x0) {
      bVar2 = ImFont::IsLoaded(pIVar5->DstFont);
      bVar13 = true;
      if (bVar2) {
        bVar13 = pIVar5->DstFont->ContainerAtlas == local_18;
      }
    }
    if (!bVar13) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                    ,0x930,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    pIVar4->DstIndex = -1;
    font_offset = 0;
    while( true ) {
      bVar13 = false;
      if (font_offset < (local_18->Fonts).Size) {
        bVar13 = pIVar4->DstIndex == -1;
      }
      if (!bVar13) break;
      pIVar1 = pIVar5->DstFont;
      ppIVar6 = ImVector<ImFont_*>::operator[](&local_18->Fonts,font_offset);
      if (pIVar1 == *ppIVar6) {
        pIVar4->DstIndex = font_offset;
      }
      font_offset = font_offset + 1;
    }
    if (pIVar4->DstIndex == -1) {
      if (pIVar4->DstIndex == -1) {
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                      ,0x939,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      atlas_local._7_1_ = 0;
      goto LAB_003331a5;
    }
    iVar3 = stbtt_GetFontOffsetForIndex((uchar *)pIVar5->FontData,pIVar5->FontNo);
    if (iVar3 < 0) {
      __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                    ,0x93e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    iVar3 = stbtt_InitFont(&pIVar4->FontInfo,(uchar *)pIVar5->FontData,iVar3);
    if (iVar3 == 0) {
      atlas_local._7_1_ = 0;
      goto LAB_003331a5;
    }
    pIVar7 = ImVector<ImFontBuildDstData>::operator[]
                       ((ImVector<ImFontBuildDstData> *)local_48,pIVar4->DstIndex);
    if (pIVar5->GlyphRanges == (ImWchar *)0x0) {
      local_388 = ImFontAtlas::GetGlyphRangesDefault(local_18);
    }
    else {
      local_388 = pIVar5->GlyphRanges;
    }
    pIVar4->SrcRanges = local_388;
    _src_i_1 = pIVar4->SrcRanges;
    while( true ) {
      bVar13 = false;
      if (*_src_i_1 != 0) {
        bVar13 = _src_i_1[1] != 0;
      }
      if (!bVar13) break;
      iVar3 = ImMax<int>(pIVar4->GlyphsHighest,_src_i_1[1]);
      pIVar4->GlyphsHighest = iVar3;
      _src_i_1 = _src_i_1 + 2;
    }
    pIVar7->SrcCount = pIVar7->SrcCount + 1;
    iVar3 = ImMax<int>(pIVar7->GlyphsHighest,pIVar4->GlyphsHighest);
    pIVar7->GlyphsHighest = iVar3;
    src_tmp._0_4_ = (int)src_tmp + 1;
  } while( true );
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}